

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O0

bool __thiscall
CAPSFile::GetStreamGapItem
          (CAPSFile *this,StreamItem *item,uchar *buffer,uint *offset,uint size_of_buffer)

{
  uint uVar1;
  bool bVar2;
  int local_48;
  uint local_44;
  int j;
  int gap_size;
  int type;
  int size;
  uchar b;
  uint size_of_buffer_local;
  uint *offset_local;
  uchar *buffer_local;
  StreamItem *item_local;
  CAPSFile *this_local;
  
  uVar1 = *offset;
  *offset = uVar1 + 1;
  type._3_1_ = buffer[uVar1];
  if (type._3_1_ == 0) {
    return false;
  }
  memset(item,0,8);
  while( true ) {
    bVar2 = false;
    if (type._3_1_ != 0) {
      bVar2 = *offset < size_of_buffer;
    }
    if (!bVar2) break;
    local_44 = 0;
    for (local_48 = 0; local_48 < (int)(uint)type._3_1_ >> 5; local_48 = local_48 + 1) {
      uVar1 = *offset;
      *offset = uVar1 + 1;
      local_44 = ((uint)buffer[uVar1] <<
                 (((char)((int)(uint)type._3_1_ >> 5) - ((char)local_48 + '\x01')) * '\b' & 0x1fU))
                 + local_44;
    }
    if ((type._3_1_ & 0x1f) == 1) {
      item->size = local_44;
    }
    else {
      if ((type._3_1_ & 0x1f) != 2) {
        return false;
      }
      uVar1 = *offset;
      *offset = uVar1 + 1;
      item->sample = buffer[uVar1];
      item->sample_size = (uchar)local_44;
    }
    uVar1 = *offset;
    *offset = uVar1 + 1;
    type._3_1_ = buffer[uVar1];
  }
  return true;
}

Assistant:

bool CAPSFile::GetStreamGapItem(CAPSFile::StreamItem* item, unsigned char* buffer, unsigned int& offset,
                                unsigned int size_of_buffer)
{
   // Next stream item
   unsigned char b = buffer[offset++];

   if (b == 0) return false;

   memset(item, 0, sizeof(StreamItem));
   while (b != 0 && offset < size_of_buffer)
   {
      int size = b >> 5;
      int type = b & 0x1F;
      int gap_size = 0;
      for (int j = 0; j < size; j++)
      {
         gap_size += (buffer[offset++] << (8 * (size - (j + 1))));
      }

      if (type == 1)
      {
         item->size = gap_size;
      }
      else if (type == 2)
      {
         item->sample = buffer[offset++];
         item->sample_size = gap_size;
      }
      else return false;

      b = buffer[offset++];
   }
   return true;
}